

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

int32_t icu_63::anon_unknown_15::getJamoTMinusBase(uint8_t *src,uint8_t *limit)

{
  byte bVar1;
  uint8_t t_1;
  uint8_t t;
  uint8_t *limit_local;
  uint8_t *src_local;
  
  if ((2 < (long)limit - (long)src) && (*src == 0xe1)) {
    if (src[1] == 0x86) {
      bVar1 = src[2];
      if ((0xa7 < bVar1) && (bVar1 < 0xc0)) {
        return bVar1 - 0xa7;
      }
    }
    else if ((src[1] == 0x87) && ((char)src[2] < -0x7d)) {
      return src[2] - 0x67;
    }
  }
  return -1;
}

Assistant:

int32_t getJamoTMinusBase(const uint8_t *src, const uint8_t *limit) {
    // Jamo T: E1 86 A8..E1 87 82
    if ((limit - src) >= 3 && *src == 0xe1) {
        if (src[1] == 0x86) {
            uint8_t t = src[2];
            // The first Jamo T is U+11A8 but JAMO_T_BASE is 11A7.
            // Offset 0 does not correspond to any conjoining Jamo.
            if (0xa8 <= t && t <= 0xbf) {
                return t - 0xa7;
            }
        } else if (src[1] == 0x87) {
            uint8_t t = src[2];
            if ((int8_t)t <= (int8_t)0x82u) {
                return t - (0xa7 - 0x40);
            }
        }
    }
    return -1;
}